

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlibversion.cpp
# Opt level: O0

Version trun::TestLibVersion::FromVersion(version_t rawVersion)

{
  Version VVar1;
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  Version version;
  version_t rawVersion_local;
  
  version = (Version)rawVersion;
  memset(&local_20,0,8);
  local_20 = version.data._3_1_;
  uStack_1f = version.data._2_1_;
  uStack_1e = version.data._1_1_;
  uStack_1d = version.data._0_1_;
  if (CONCAT13(uStack_1d,CONCAT12(uStack_1e,CONCAT11(uStack_1f,local_20))) == 0x5f4b4e47) {
    rawVersion_local =
         CONCAT17(version.prefix[0] + -0x30,
                  CONCAT16(version.prefix[1] + -0x30,
                           CONCAT15(version.prefix[2] + -0x30,
                                    CONCAT14(version.prefix[3] + -0x30,
                                             CONCAT13(uStack_1d,
                                                      CONCAT12(uStack_1e,
                                                               CONCAT11(uStack_1f,local_20)))))));
  }
  else {
    fprintf(_stderr,
            "ERR: wrong version prefix - reverting to V1 and trying (this can cause a crash)\n");
    rawVersion_local = (version_t)FromVersion(0x474e4b5f30313030);
  }
  VVar1.prefix[0] = (undefined1)rawVersion_local;
  VVar1.prefix[1] = rawVersion_local._1_1_;
  VVar1.prefix[2] = rawVersion_local._2_1_;
  VVar1.prefix[3] = rawVersion_local._3_1_;
  VVar1.data = (anon_union_4_2_43ae805c_for_data)rawVersion_local._4_4_;
  return VVar1;
}

Assistant:

Version TestLibVersion::FromVersion(version_t rawVersion) {
    Version version = {};

    // Check prefix...
    version.prefix[0] = ((rawVersion>>56) & 255);
    version.prefix[1] = ((rawVersion>>48) & 255);
    version.prefix[2] = ((rawVersion>>40) & 255);
    version.prefix[3] = ((rawVersion>>32) & 255);

    // Unknown version - return version 1
    if (memcmp(version.prefix, "GNK_", 4)) {
        fprintf(stderr,"ERR: wrong version prefix - reverting to V1 and trying (this can cause a crash)\n");
        return TestLibVersion::FromVersion(TRUN_MAGICAL_IF_VERSION1);
    }

#define ASCII_TO_NUM(x) ((x) - '0')

    version.data.ver.zero = ASCII_TO_NUM((rawVersion>>24) & 255);
    version.data.ver.major = ASCII_TO_NUM((rawVersion>>16) & 255);
    version.data.ver.minor = ASCII_TO_NUM((rawVersion>>8) & 255);
    version.data.ver.patch = ASCII_TO_NUM(rawVersion & 255);

#undef ASCII_TO_NUM
    return version;
}